

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

JSON __thiscall
qpdf::Stream::getStreamJSON
          (Stream *this,int json_version,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  qpdf_stream_decode_level_e qVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Stream *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  JSON JVar4;
  string *in_stack_00000008;
  string local_e8;
  JSON local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  JSON local_90;
  Pl_Buffer pb;
  Writer jw;
  
  this_01 = (Stream *)CONCAT44(in_register_00000034,json_version);
  Pl_Buffer::Pl_Buffer(&pb,"streamjson",(Pipeline *)0x0);
  jw.first = true;
  jw.indent = 0;
  jw.p = &pb.super_Pipeline;
  qVar3 = writeStreamJSON(this_01,json_data,&jw,decode_level,(qpdf_stream_decode_level_e)p,
                          (Pipeline *)data_filename,in_stack_00000008,true);
  Pl_Buffer::finish(&pb);
  Pl_Buffer::getString_abi_cxx11_(&local_e8,&pb);
  JSON::parse((JSON *)this,&local_e8);
  paVar1 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (decode_level == qpdf_dl_generalized) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"data","");
    peVar2 = (this_01->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this_01->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    local_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_b8._M_unused._M_object = operator_new(0x18);
    *(element_type **)local_b8._M_unused._0_8_ = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b8._M_unused._0_8_ + 8) = this_00
    ;
    *(qpdf_stream_decode_level_e *)((long)local_b8._M_unused._0_8_ + 0x10) = qVar3;
    pcStack_a0 = std::
                 _Function_handler<void_(Pipeline_*),_(anonymous_namespace)::StreamBlobProvider>::
                 _M_invoke;
    local_a8 = std::_Function_handler<void_(Pipeline_*),_(anonymous_namespace)::StreamBlobProvider>
               ::_M_manager;
    JSON::makeBlob(&local_c8,(function<void_(Pipeline_*)> *)&local_b8);
    JSON::addDictionaryMember(&local_90,(string *)this,(JSON *)&local_e8);
    if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  Pl_Buffer::~Pl_Buffer(&pb);
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
Stream::getStreamJSON(
    int json_version,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename)
{
    Pl_Buffer pb{"streamjson"};
    JSON::Writer jw{&pb, 0};
    decode_level =
        writeStreamJSON(json_version, jw, json_data, decode_level, p, data_filename, true);
    pb.finish();
    auto result = JSON::parse(pb.getString());
    if (json_data == qpdf_sj_inline) {
        result.addDictionaryMember("data", JSON::makeBlob(StreamBlobProvider(*this, decode_level)));
    }
    return result;
}